

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O2

ze_result_t validation_layer::zeEventPoolDestroy(ze_event_pool_handle_t hEventPool)

{
  Logger *this;
  code *pcVar1;
  long *plVar2;
  long lVar3;
  ze_result_t result;
  ze_result_t zVar4;
  size_t i;
  long lVar5;
  long lVar6;
  size_t i_1;
  allocator local_51;
  string local_50;
  
  lVar3 = context;
  this = *(Logger **)(context + 0xd50);
  std::__cxx11::string::string((string *)&local_50,"zeEventPoolDestroy(hEventPool)",&local_51);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar1 = *(code **)(lVar3 + 0x468);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar6 = *(long *)(lVar3 + 0xd38) - *(long *)(lVar3 + 0xd30) >> 3;
    lVar5 = 0;
    do {
      if (lVar6 == lVar5) {
        if ((*(char *)(lVar3 + 4) != '\x01') ||
           (result = ZEHandleLifetimeValidation::zeEventPoolDestroyPrologue
                               (*(ZEHandleLifetimeValidation **)(lVar3 + 0xd48),hEventPool),
           result == ZE_RESULT_SUCCESS)) {
          zVar4 = (*pcVar1)(hEventPool);
          lVar5 = 0;
          goto LAB_0014d12c;
        }
        break;
      }
      plVar2 = (long *)**(undefined8 **)(*(long *)(lVar3 + 0xd30) + lVar5 * 8);
      result = (**(code **)(*plVar2 + 0x3d0))(plVar2,hEventPool);
      lVar5 = lVar5 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_0014d157;
  while( true ) {
    plVar2 = (long *)**(undefined8 **)(*(long *)(lVar3 + 0xd30) + lVar5 * 8);
    result = (**(code **)(*plVar2 + 0x3d8))(plVar2,hEventPool,zVar4);
    lVar5 = lVar5 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_0014d12c:
    result = zVar4;
    if (lVar6 == lVar5) break;
  }
LAB_0014d157:
  logAndPropagateResult("zeEventPoolDestroy",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventPoolDestroy(
        ze_event_pool_handle_t hEventPool               ///< [in][release] handle of event pool object to destroy
        )
    {
        context.logger->log_trace("zeEventPoolDestroy(hEventPool)");

        auto pfnDestroy = context.zeDdiTable.EventPool.pfnDestroy;

        if( nullptr == pfnDestroy )
            return logAndPropagateResult("zeEventPoolDestroy", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeEventPoolDestroyPrologue( hEventPool );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeEventPoolDestroy", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeEventPoolDestroyPrologue( hEventPool );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeEventPoolDestroy", result);
        }

        auto driver_result = pfnDestroy( hEventPool );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeEventPoolDestroyEpilogue( hEventPool ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeEventPoolDestroy", result);
        }

        return logAndPropagateResult("zeEventPoolDestroy", driver_result);
    }